

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void print_options(void)

{
  char *pcVar1;
  nh_menuitem_conflict *items;
  long lVar2;
  nh_menuitem *_item_;
  wchar_t wVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  wchar_t wVar8;
  char buf [256];
  
  items = (nh_menuitem_conflict *)malloc(0xa78);
  items->id = L'\0';
  items->role = MI_HEADING;
  items->accel = '\0';
  items->group_accel = '\0';
  items->selected = '\0';
  builtin_strncpy(items->caption,"Birth options:",0xf);
  lVar2 = nh_get_options(0);
  lVar2 = lVar2 + 8;
  wVar3 = L'\n';
  uVar5 = 1;
  lVar4 = 0x42e;
  while( true ) {
    if (*(long *)(lVar2 + -8) == 0) break;
    snprintf(buf,0x100,"%s\t%s");
    if ((long)wVar3 <= (long)uVar5) {
      wVar3 = wVar3 * 2;
      items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
    }
    *(undefined8 *)((long)items + lVar4 + -0x322) = 0;
    *(undefined2 *)((long)items + lVar4 + -0x21a) = 0;
    items[-2].caption[lVar4 + -8] = '\0';
    strcpy((char *)((long)items + lVar4 + -0x31a),buf);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10c;
    lVar2 = lVar2 + 0x30;
  }
  if (wVar3 <= (wchar_t)uVar5) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  uVar6 = uVar5 & 0xffffffff;
  items[uVar6].accel = '\0';
  items[uVar6].group_accel = '\0';
  items[uVar6].selected = '\0';
  items[uVar6].id = L'\0';
  items[uVar6].role = MI_TEXT;
  uVar7 = uVar5 + 4;
  items[uVar6].caption[0] = '\0';
  if (wVar3 <= (wchar_t)(uVar5 + 1)) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  uVar6 = uVar5 + 2;
  uVar5 = uVar5 + 1 & 0xffffffff;
  items[uVar5].id = L'\0';
  items[uVar5].role = MI_HEADING;
  items[uVar5].accel = '\0';
  items[uVar5].group_accel = '\0';
  items[uVar5].selected = '\0';
  builtin_strncpy(items[uVar5].caption,"Game opt",8);
  builtin_strncpy(items[uVar5].caption + 6,"ptions:",8);
  lVar2 = nh_get_options(2);
  lVar2 = lVar2 + 8;
  while( true ) {
    if (*(long *)(lVar2 + -8) == 0) break;
    snprintf(buf,0x100,"%s\t%s");
    if (wVar3 <= (wchar_t)uVar6) {
      wVar3 = wVar3 * 2;
      items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
    }
    pcVar1 = items->caption + lVar4 + -8;
    *(undefined8 *)(pcVar1 + -0x10a) = 0;
    *(undefined2 *)(pcVar1 + -2) = MI_TEXT >> 0x10;
    *pcVar1 = '\0';
    strcpy(pcVar1 + -0x102,buf);
    uVar6 = uVar6 + 1;
    uVar7 = (ulong)((int)uVar7 + 1);
    lVar2 = lVar2 + 0x30;
    lVar4 = lVar4 + 0x10c;
  }
  if (wVar3 <= (wchar_t)uVar6) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  uVar6 = uVar6 & 0xffffffff;
  items[uVar6].accel = '\0';
  items[uVar6].group_accel = '\0';
  items[uVar6].selected = '\0';
  items[uVar6].id = L'\0';
  items[uVar6].role = MI_TEXT;
  wVar8 = (int)uVar7 + L'\xffffffff';
  items[uVar6].caption[0] = '\0';
  if (wVar3 <= wVar8) {
    wVar3 = wVar3 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
  }
  items[(uint)wVar8].id = L'\0';
  items[(uint)wVar8].role = MI_HEADING;
  items[(uint)wVar8].accel = '\0';
  items[(uint)wVar8].group_accel = '\0';
  items[(uint)wVar8].selected = '\0';
  builtin_strncpy(items[(uint)wVar8].caption,"Interface option",0x10);
  builtin_strncpy(items[(uint)wVar8].caption + 0xf,"ns:",4);
  lVar2 = (uVar7 & 0xffffffff) * 0x10c + 0x10a;
  lVar4 = 0x12cf68;
  while( true ) {
    wVar8 = (wchar_t)uVar7;
    if (*(long *)(lVar4 + -8) == 0) break;
    snprintf(buf,0x100,"%s\t%s");
    if (wVar3 <= wVar8) {
      wVar3 = wVar3 * 2;
      items = (nh_menuitem_conflict *)realloc(items,(long)wVar3 * 0x10c);
    }
    pcVar1 = items->caption + lVar2 + -8;
    *(undefined8 *)(pcVar1 + -0x10a) = 0;
    *(undefined2 *)(pcVar1 + -2) = MI_TEXT >> 0x10;
    *pcVar1 = '\0';
    strcpy(pcVar1 + -0x102,buf);
    lVar4 = lVar4 + 0x30;
    uVar7 = (ulong)(uint)(wVar8 + L'\x01');
    lVar2 = lVar2 + 0x10c;
  }
  curses_display_menu(items,wVar8,"Available options:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void print_options(void)
{
    struct nh_menuitem *items;
    int i, icount, size;
    char buf[BUFSZ];
    struct nh_option_desc *options;

    icount = 0; size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
    options = nh_get_options(CURRENT_BIRTH_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
    options = nh_get_options(GAME_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);

    /* add UI specific options */
    add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
    for (i = 0; curses_options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", curses_options[i].name, curses_options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }

    curses_display_menu(items, icount, "Available options:", PICK_NONE, NULL);
    free(items);
}